

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_expr.cc
# Opt level: O2

string * __thiscall
Expr::SetFunc_abi_cxx11_(string *__return_storage_ptr__,Expr *this,Output *out,Env *env)

{
  char *__s;
  Exception *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_98;
  string local_78;
  string parent_val;
  string local_38;
  
  if (this->expr_type_ == EXPR_MEMBER) {
    __s = EvalExpr(this->operand_[0],out,env);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&parent_val,__s,(allocator<char> *)&bStack_98);
    std::operator+(&bStack_98,&parent_val,"->");
    set_function_abi_cxx11_(&local_78,this->operand_[1]->id_);
    std::operator+(__return_storage_ptr__,&bStack_98,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&bStack_98);
    std::__cxx11::string::~string((string *)&parent_val);
  }
  else {
    if (this->expr_type_ != EXPR_ID) {
      this_00 = (Exception *)__cxa_allocate_exception(0x20);
      strfmt_abi_cxx11_(&local_38,"cannot generate set function for expression `%s\'",
                        (this->orig_)._M_dataplus._M_p);
      Exception::Exception(this_00,&this->super_Object,&local_38);
      __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
    }
    set_function_abi_cxx11_(__return_storage_ptr__,this->id_);
  }
  return __return_storage_ptr__;
}

Assistant:

string Expr::SetFunc(Output* out, Env* env)
	{
	switch ( expr_type_ )
		{
		case EXPR_ID:
			return set_function(id_);
		case EXPR_MEMBER:
			{
			// Evaluate the parent
			string parent_val(operand_[0]->EvalExpr(out, env));
			return parent_val + "->" + set_function(operand_[1]->id());
			}
			break;
		default:
			throw Exception(this, strfmt("cannot generate set function "
			                             "for expression `%s'",
			                             orig()));
			break;
		}
	}